

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::AdvancedSSOSimple::Cleanup(AdvancedSSOSimple *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_vbo);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&this->m_texture);
  if (this->pipeline == true) {
    glu::CallLogWrapper::glDeleteProgram(this_00,this->m_vsp);
    glu::CallLogWrapper::glDeleteProgram(this_00,this->m_fsp0);
    glu::CallLogWrapper::glDeleteProgram(this_00,this->m_fsp1);
    glu::CallLogWrapper::glDeleteProgramPipelines(this_00,2,this->m_pipeline);
  }
  else {
    glu::CallLogWrapper::glDeleteProgram(this_00,this->m_program[0]);
    glu::CallLogWrapper::glDeleteProgram(this_00,this->m_program[1]);
  }
  glu::CallLogWrapper::glDeleteProgram(this_00,this->c_program);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_vao);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_buffer);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glUseProgram(0);
		glDeleteBuffers(1, &m_vbo);
		glDeleteTextures(1, &m_texture);
		if (pipeline)
		{
			glDeleteProgram(m_vsp);
			glDeleteProgram(m_fsp0);
			glDeleteProgram(m_fsp1);
			glDeleteProgramPipelines(2, m_pipeline);
		}
		else
		{
			glDeleteProgram(m_program[0]);
			glDeleteProgram(m_program[1]);
		}
		glDeleteProgram(c_program);
		glDeleteVertexArrays(1, &m_vao);
		glDeleteBuffers(1, &m_buffer);
		return NO_ERROR;
	}